

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_teamcity.hpp
# Opt level: O0

void __thiscall
Catch::TeamCityReporter::testGroupEnded(TeamCityReporter *this,TestGroupStats *testGroupStats)

{
  ostream *poVar1;
  StreamingReporterBase<Catch::TeamCityReporter> *in_RDI;
  string *in_stack_000001f8;
  TestGroupStats *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  StreamingReporterBase<Catch::TeamCityReporter>::testGroupEnded(in_RDI,in_stack_ffffffffffffff98);
  poVar1 = std::operator<<(in_RDI->stream,"##teamcity[testSuiteFinished name=\'");
  escape(in_stack_000001f8);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"\']\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void testGroupEnded( TestGroupStats const& testGroupStats ) override {
            StreamingReporterBase::testGroupEnded( testGroupStats );
            stream << "##teamcity[testSuiteFinished name='"
                << escape( testGroupStats.groupInfo.name ) << "']\n";
        }